

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O3

anytype_t * ps_config_set_float(ps_config_t *config,char *name,double val)

{
  anytype_t *val_00;
  anytype_t *paVar1;
  
  val_00 = &cmd_ln_access_r(config,name)->val;
  if (val_00 == (anytype_t *)0x0) {
    val_00 = (anytype_t *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
            ,0x333,"Unknown parameter %s\n",name);
  }
  else {
    paVar1 = anytype_from_float(val_00,*(int *)(val_00 + 1),val);
    if (paVar1 == (anytype_t *)0x0) {
      val_00 = (anytype_t *)0x0;
    }
  }
  return val_00;
}

Assistant:

const anytype_t *
ps_config_set_float(ps_config_t *config, char const *name, double val)
{
    cmd_ln_val_t *cval = cmd_ln_access_r(config, name);
    if (cval == NULL) {
        E_ERROR("Unknown parameter %s\n", name);
        return NULL;
    }
    if (anytype_from_float(&cval->val, cval->type, val) == NULL) {
        return NULL;
    }
    return &cval->val;
}